

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

__m256i * cross_sum(int32_t *buf,int stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int in_ESI;
  int iVar10;
  undefined4 in_register_00000034;
  __m256i *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 in_XMM0_Qb;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 in_YMM0_H;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 in_register_00001218;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  __m256i threes;
  __m256i fours;
  __m256i xbr;
  __m256i xb;
  __m256i xbl;
  __m256i xr;
  __m256i x;
  __m256i xl;
  __m256i xtr;
  __m256i xt;
  __m256i xtl;
  
  iVar10 = in_ESI;
  yy_loadu_256((__m256i *)((long)in_RDI + (long)in_ESI * -4 + -4),
               (void *)CONCAT44(in_register_00000034,in_ESI));
  uVar11 = in_XMM0_Qa;
  uVar19 = in_XMM0_Qb;
  uVar27 = in_YMM0_H;
  uVar35 = in_register_00001218;
  yy_loadu_256((__m256i *)((long)in_RDI + (long)in_ESI * -4),
               (void *)CONCAT44(in_register_00000034,iVar10));
  uVar12 = uVar11;
  uVar20 = uVar19;
  uVar28 = uVar27;
  uVar36 = uVar35;
  yy_loadu_256((__m256i *)((long)in_RDI + (long)in_ESI * -4 + 4),
               (void *)CONCAT44(in_register_00000034,iVar10));
  uVar13 = uVar12;
  uVar21 = uVar20;
  uVar29 = uVar28;
  uVar37 = uVar36;
  yy_loadu_256((__m256i *)((long)in_RDI[-1] + 0x1c),(void *)CONCAT44(in_register_00000034,iVar10));
  uVar14 = uVar13;
  uVar22 = uVar21;
  uVar30 = uVar29;
  uVar38 = uVar37;
  yy_loadu_256(in_RDI,(void *)CONCAT44(in_register_00000034,iVar10));
  uVar15 = uVar14;
  uVar23 = uVar22;
  uVar31 = uVar30;
  uVar39 = uVar38;
  yy_loadu_256((__m256i *)((long)*in_RDI + 4),(void *)CONCAT44(in_register_00000034,iVar10));
  uVar16 = uVar15;
  uVar24 = uVar23;
  uVar32 = uVar31;
  uVar40 = uVar39;
  yy_loadu_256((__m256i *)((long)in_RDI[-1] + (long)in_ESI * 4 + 0x1c),
               (void *)CONCAT44(in_register_00000034,iVar10));
  uVar17 = uVar16;
  uVar25 = uVar24;
  uVar33 = uVar32;
  uVar41 = uVar40;
  yy_loadu_256((__m256i *)((long)*in_RDI + (long)in_ESI * 4),
               (void *)CONCAT44(in_register_00000034,iVar10));
  uVar18 = uVar17;
  uVar26 = uVar25;
  uVar34 = uVar33;
  uVar42 = uVar41;
  yy_loadu_256((__m256i *)((long)*in_RDI + (long)in_ESI * 4 + 4),
               (void *)CONCAT44(in_register_00000034,iVar10));
  auVar9._8_8_ = uVar25;
  auVar9._0_8_ = uVar17;
  auVar9._16_8_ = uVar33;
  auVar9._24_8_ = uVar41;
  auVar1._8_8_ = uVar22;
  auVar1._0_8_ = uVar14;
  auVar1._16_8_ = uVar30;
  auVar1._24_8_ = uVar38;
  auVar1 = vpaddd_avx2(auVar9,auVar1);
  auVar8._8_8_ = uVar23;
  auVar8._0_8_ = uVar15;
  auVar8._16_8_ = uVar31;
  auVar8._24_8_ = uVar39;
  auVar1 = vpaddd_avx2(auVar8,auVar1);
  auVar7._8_8_ = uVar19;
  auVar7._0_8_ = uVar11;
  auVar7._16_8_ = uVar27;
  auVar7._24_8_ = uVar35;
  auVar1 = vpaddd_avx2(auVar7,auVar1);
  auVar6._8_8_ = uVar21;
  auVar6._0_8_ = uVar13;
  auVar6._16_8_ = uVar29;
  auVar6._24_8_ = uVar37;
  auVar1 = vpaddd_avx2(auVar6,auVar1);
  auVar5._8_8_ = uVar26;
  auVar5._0_8_ = uVar18;
  auVar5._16_8_ = uVar34;
  auVar5._24_8_ = uVar42;
  auVar2._8_8_ = uVar24;
  auVar2._0_8_ = uVar16;
  auVar2._16_8_ = uVar32;
  auVar2._24_8_ = uVar40;
  auVar2 = vpaddd_avx2(auVar5,auVar2);
  auVar4._8_8_ = uVar20;
  auVar4._0_8_ = uVar12;
  auVar4._16_8_ = uVar28;
  auVar4._24_8_ = uVar36;
  auVar2 = vpaddd_avx2(auVar4,auVar2);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar1 = vpslld_avx2(auVar1,ZEXT416(2));
  vpsubd_avx2(auVar1,auVar2);
  return (__m256i *)0x2;
}

Assistant:

static inline __m256i cross_sum(const int32_t *buf, int stride) {
  const __m256i xtl = yy_loadu_256(buf - 1 - stride);
  const __m256i xt = yy_loadu_256(buf - stride);
  const __m256i xtr = yy_loadu_256(buf + 1 - stride);
  const __m256i xl = yy_loadu_256(buf - 1);
  const __m256i x = yy_loadu_256(buf);
  const __m256i xr = yy_loadu_256(buf + 1);
  const __m256i xbl = yy_loadu_256(buf - 1 + stride);
  const __m256i xb = yy_loadu_256(buf + stride);
  const __m256i xbr = yy_loadu_256(buf + 1 + stride);

  const __m256i fours = _mm256_add_epi32(
      xl, _mm256_add_epi32(xt, _mm256_add_epi32(xr, _mm256_add_epi32(xb, x))));
  const __m256i threes =
      _mm256_add_epi32(xtl, _mm256_add_epi32(xtr, _mm256_add_epi32(xbr, xbl)));

  return _mm256_sub_epi32(_mm256_slli_epi32(_mm256_add_epi32(fours, threes), 2),
                          threes);
}